

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

string_type * __thiscall ghc::filesystem::path::native_abi_cxx11_(path *this)

{
  path *this_local;
  
  return &this->_path;
}

Assistant:

GHC_INLINE const path::string_type& path::native() const
{
#ifdef GHC_OS_WINDOWS
#ifdef GHC_USE_WCHAR_T
    _native_cache = detail::fromUtf8<string_type>(native_impl());
#else
    _native_cache = native_impl();
#endif
    return _native_cache;
#else
    return _path;
#endif
}